

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

bool __thiscall wabt::WastParser::ParseBindVarOpt(WastParser *this,string *name)

{
  TokenType TVar1;
  Token token;
  long *local_80 [2];
  long local_70 [2];
  Token local_60;
  
  TVar1 = Peek(this,0);
  if (TVar1 == Last_String) {
    Consume(&local_60,this);
    if (5 < local_60.token_type_ - AlignEqNat) {
      __assert_fail("HasText()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/include/wabt/token.h"
                    ,99,"std::string_view wabt::Token::text() const");
    }
    local_80[0] = local_70;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_80,local_60.field_2.text_._M_str,
               local_60.field_2.text_._M_str + local_60.field_2.text_._M_len);
    std::__cxx11::string::operator=((string *)name,(string *)local_80);
    if (local_80[0] != local_70) {
      operator_delete(local_80[0],local_70[0] + 1);
    }
  }
  return TVar1 == Last_String;
}

Assistant:

bool WastParser::ParseBindVarOpt(std::string* name) {
  WABT_TRACE(ParseBindVarOpt);
  if (!PeekMatch(TokenType::Var)) {
    return false;
  }
  Token token = Consume();
  *name = std::string(token.text());
  return true;
}